

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argument.hpp
# Opt level: O3

void __thiscall
boost::runtime::arguments_store::
set<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          (arguments_store *this,cstring *parameter_name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *value)

{
  element_type *peVar1;
  shared_count sVar2;
  typed_argument<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *p;
  mapped_type *pmVar3;
  shared_ptr<boost::runtime::argument> local_48;
  element_type *local_30;
  shared_count local_28;
  
  p = (typed_argument<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       *)operator_new(0x28);
  (p->super_argument).p_value_type =
       (id_t)&rtti::rtti_detail::
              rttid_holder<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::
              inst()::s_inst_abi_cxx11_;
  (p->super_argument)._vptr_argument = (_func_int **)&PTR__typed_argument_001caa50;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&p->p_value,value);
  shared_ptr<boost::runtime::argument>::
  shared_ptr<boost::runtime::typed_argument<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (&local_48,p);
  pmVar3 = std::
           map<boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>_>_>
           ::operator[](&this->m_arguments,parameter_name);
  sVar2.pi_ = local_48.pn.pi_;
  peVar1 = local_48.px;
  local_48.px = (element_type *)0x0;
  local_48.pn.pi_ = (sp_counted_base *)0x0;
  local_30 = pmVar3->px;
  local_28.pi_ = (pmVar3->pn).pi_;
  pmVar3->px = peVar1;
  (pmVar3->pn).pi_ = sVar2.pi_;
  detail::shared_count::~shared_count(&local_28);
  detail::shared_count::~shared_count(&local_48.pn);
  return;
}

Assistant:

void        set( cstring parameter_name, T const& value )
    {
        m_arguments[parameter_name] = argument_ptr( new typed_argument<T>( value ) );
    }